

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_pkt.cc
# Opt level: O1

int bssl::dtls1_dispatch_alert(SSL *ssl)

{
  undefined1 *puVar1;
  ushort uVar2;
  int iVar3;
  size_t in_R9;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  
  in.size_._0_2_ = *(undefined2 *)((long)&(ssl->d1->write_epoch).next_record.combined_ + 6);
  in.data_ = (uchar *)0x2;
  in.size_._2_6_ = 0;
  iVar3 = dtls1_write_record((bssl *)ssl,(SSL *)0x15,(int)ssl->s3 + 0x1fd,in,(uint16_t)in_R9);
  if (0 < iVar3) {
    puVar1 = &ssl->s3->field_0xdc;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfbff;
    if (ssl->s3->send_alert[0] == '\x02') {
      BIO_flush((ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    }
    iVar3 = 1;
    in_00.size_ = in_R9;
    in_00.data_ = (uchar *)0x2;
    ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x15,(int)ssl->s3 + 0x1fd,in_00);
    uVar2 = *(ushort *)ssl->s3->send_alert;
    ssl_do_info_callback(ssl,0x4008,(uint)(ushort)(uVar2 << 8 | uVar2 >> 8));
  }
  return iVar3;
}

Assistant:

int dtls1_dispatch_alert(SSL *ssl) {
  int ret = dtls1_write_record(ssl, SSL3_RT_ALERT, ssl->s3->send_alert,
                               ssl->d1->write_epoch.epoch());
  if (ret <= 0) {
    return ret;
  }
  ssl->s3->alert_dispatch = false;

  // If the alert is fatal, flush the BIO now.
  if (ssl->s3->send_alert[0] == SSL3_AL_FATAL) {
    BIO_flush(ssl->wbio.get());
  }

  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_ALERT, ssl->s3->send_alert);

  int alert = (ssl->s3->send_alert[0] << 8) | ssl->s3->send_alert[1];
  ssl_do_info_callback(ssl, SSL_CB_WRITE_ALERT, alert);

  return 1;
}